

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O3

void __thiscall
QAbstractFileEngineHandler::~QAbstractFileEngineHandler(QAbstractFileEngineHandler *this)

{
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this_00;
  QList<QAbstractFileEngineHandler_*> *c;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this_01;
  long in_FS_OFFSET;
  QAbstractFileEngineHandler *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QAbstractFileEngineHandler = (_func_int **)&PTR__QAbstractFileEngineHandler_00696140;
  this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             *)this;
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
               ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
                             *)this);
  if (((ulong)this_00 & 1) == 0 &&
      this_00 !=
      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *)0x0
     ) {
    this_01 = this_00;
    QReadWriteLock::lockForWrite((QReadWriteLock *)this_00);
    this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
               *)((ulong)this_00 | 1);
  }
  if (qt_abstractfileenginehandlerlist_shutDown == '\0') {
    c = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>::
         operator()(this_01)->super_QList<QAbstractFileEngineHandler_*>;
    local_28 = this;
    QtPrivate::sequential_erase_one<QList<QAbstractFileEngineHandler*>,QAbstractFileEngineHandler*>
              (c,&local_28);
    if ((c->d).size == 0) {
      qt_file_engine_handlers_in_use._q_value.super___atomic_base<int>._M_i =
           (Type)(__atomic_base<int>)0x0;
    }
  }
  if (((ulong)this_00 & 1) != 0) {
    QReadWriteLock::unlock((QReadWriteLock *)((ulong)this_00 & 0xfffffffffffffffe));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngineHandler::~QAbstractFileEngineHandler()
{
    QWriteLocker locker(fileEngineHandlerMutex());
    // Remove this handler from the handler list only if the list is valid.
    if (!qt_abstractfileenginehandlerlist_shutDown) {
        QAbstractFileEngineHandlerList *handlers = fileEngineHandlers();
        handlers->removeOne(this);
        if (handlers->isEmpty())
            qt_file_engine_handlers_in_use.storeRelaxed(false);
    }
}